

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  int iVar1;
  ImGuiTabItem *__src;
  ImGuiTabItem *__src_00;
  ImVector<ImGuiTabItem> *in_RDI;
  ImGuiTabItem item_tmp;
  ImGuiTabItem *tab2;
  int tab2_order;
  ImGuiTabItem *tab1;
  ImGuiTabBar *in_stack_ffffffffffffffa8;
  ImGuiTabBar *in_stack_ffffffffffffffb0;
  bool local_1;
  
  __src = TabBarFindTabByID(in_stack_ffffffffffffffa8,0);
  if ((__src == (ImGuiTabItem *)0x0) || ((__src->Flags & 0x20U) != 0)) {
    local_1 = false;
  }
  else {
    iVar1 = ImGuiTabBar::GetTabOrder
                      (in_stack_ffffffffffffffb0,(ImGuiTabItem *)in_stack_ffffffffffffffa8);
    iVar1 = iVar1 + *(char *)&in_RDI[6].Data;
    if ((iVar1 < 0) || (in_RDI->Size <= iVar1)) {
      local_1 = false;
    }
    else {
      __src_00 = ImVector<ImGuiTabItem>::operator[](in_RDI,iVar1);
      if ((__src_00->Flags & 0x20U) == 0) {
        if ((__src->Flags & 0xc0U) == (__src_00->Flags & 0xc0U)) {
          memcpy(&stack0xffffffffffffffb4,__src,0x24);
          memcpy(__src,__src_00,0x23);
          memcpy(__src_00,&stack0xffffffffffffffb4,0x23);
          if ((in_RDI[1].Size & 0x400000U) != 0) {
            MarkIniSettingsDirty();
          }
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}